

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase1::Run(AdvancedIndirectAddressingCase1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  long lVar3;
  float data [16];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  vec3 local_40;
  vec3 local_34;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,4)
  ;
  lVar3 = 0x10;
  if (bVar1) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "\nlayout(location = 0) in vec2 g_in_position;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 0, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 1, std430) buffer MaterialIDBuffer {\n  uint g_material_id[4];\n};\nlayout(binding = 2, std430) buffer TransformBuffer {\n  vec2 translation[4];\n} g_transform;\nlayout(binding = 3, std430) buffer TransformIDBuffer {\n  uint g_transform_id[4];\n};\nout StageData {\n  vec3 color;\n} g_vs_out;\nvoid main() {\n  const uint mid = g_material_id[gl_InstanceID];\n  Material m = g_material[mid];\n  const uint tid = g_transform_id[gl_InstanceID];\n  vec2 t = g_transform.translation[tid];\n  gl_Position = vec4(g_in_position + t, 0, 1);\n  g_vs_out.color = m.color;\n}"
               ,"");
    local_a8._0_8_ = &local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,
               "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(g_fs_in.color, 1);\n}"
               ,"");
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_88,(string *)local_a8);
    this->m_program = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar3 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
      local_58 = &DAT_3f8000003f800000;
      uStack_50 = 0x3f80000000000000;
      local_68 = 0;
      puStack_60 = &DAT_3f8000003f800000;
      local_88.field_2._M_allocated_capacity = 0x3f80000000000000;
      local_88.field_2._8_8_ = 0x3f80000000000000;
      local_88._M_dataplus._M_p = (pointer)0x3f800000;
      local_88._M_string_length = 0x3f80000000000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,&local_88,0x88e8);
      local_88._M_dataplus._M_p = (pointer)0x300000002;
      local_88._M_string_length = 0x200000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_88,0x88e8);
      local_88.field_2._M_allocated_capacity = 0x3f000000bf000000;
      local_88.field_2._8_8_ = &DAT_3f0000003f000000;
      local_88._M_dataplus._M_p = (pointer)0xbf000000bf000000;
      local_88._M_string_length = 0xbf0000003f000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&local_88,0x88e8);
      local_88._M_dataplus._M_p = (pointer)0x100000003;
      local_88._M_string_length = 0x200000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_88,0x88e8);
      local_88.field_2._M_allocated_capacity = 0x3ecccccdbecccccd;
      local_88.field_2._8_8_ = 0x3ecccccd3ecccccd;
      local_88._M_dataplus._M_p = (pointer)0xbecccccdbecccccd;
      local_88._M_string_length = 0xbecccccd3ecccccd;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_88,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,4);
      local_88._M_dataplus._M_p = (pointer)0x3f800000;
      local_88._M_string_length = local_88._M_string_length & 0xffffffff00000000;
      local_a8._0_8_ = &DAT_3f8000003f800000;
      local_a8._8_4_ = 0.0;
      local_34.m_data[0] = 0.0;
      local_34.m_data[1] = 0.0;
      local_34.m_data[2] = 1.0;
      local_40.m_data[0] = 0.0;
      local_40.m_data[1] = 0.0;
      local_40.m_data[2] = 1.0;
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,(vec3 *)&local_88,
                         (vec3 *)local_a8,&local_34,&local_40,(int *)0x0);
      if (bVar1) {
        local_88._M_dataplus._M_p = (pointer)0x200000003;
        local_88._M_string_length = 1;
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
        glu::CallLogWrapper::glBufferSubData(this_00,0x90d2,0,0x10,&local_88);
        local_88._M_dataplus._M_p = (pointer)0x100000000;
        local_88._M_string_length = 0x300000002;
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_88,0x88e8);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,4);
        local_88._M_dataplus._M_p = &DAT_3f8000003f800000;
        local_88._M_string_length = local_88._M_string_length & 0xffffffff00000000;
        local_a8._0_8_ = (pointer)0x0;
        local_a8._8_4_ = 1.0;
        local_34.m_data[0] = 1.0;
        local_34.m_data[1] = 0.0;
        local_34.m_data[2] = 0.0;
        local_40.m_data[0] = 0.0;
        local_40.m_data[1] = 1.0;
        local_40.m_data[2] = 0.0;
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,(vec3 *)&local_88,
                           (vec3 *)local_a8,&local_34,&local_40,(int *)0x0);
        lVar3 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(4))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec2 g_in_position;" NL "struct Material {" NL "  vec3 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer MaterialBuffer {" NL "  Material g_material[4];" NL "};" NL
			   "layout(binding = 1, std430) buffer MaterialIDBuffer {" NL "  uint g_material_id[4];" NL "};" NL
			   "layout(binding = 2, std430) buffer TransformBuffer {" NL "  vec2 translation[4];" NL "} g_transform;" NL
			   "layout(binding = 3, std430) buffer TransformIDBuffer {" NL "  uint g_transform_id[4];" NL "};" NL
			   "out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL "void main() {" NL
			   "  const uint mid = g_material_id[gl_InstanceID];" NL "  Material m = g_material[mid];" NL
			   "  const uint tid = g_transform_id[gl_InstanceID];" NL "  vec2 t = g_transform.translation[tid];" NL
			   "  gl_Position = vec4(g_in_position + t, 0, 1);" NL "  g_vs_out.color = m.color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			   "void main() {" NL "  g_fs_out = vec4(g_fs_in.color, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_storage_buffer);

		/* material buffer */
		{
			const float data[] = { 1.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 0.0f, 1.0f,
								   0.0f, 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* material id buffer */
		{
			const unsigned int data[] = { 2, 3, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform buffer */
		{
			const float data[] = { -0.5f, -0.5f, 0.5f, -0.5f, -0.5f, 0.5f, 0.5f, 0.5f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform id buffer */
		{
			const unsigned int data[] = { 3, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		/* vertex buffer */
		{
			const float data[] = { -0.4f, -0.4f, 0.4f, -0.4f, -0.4f, 0.4f, 0.4f, 0.4f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 4);

		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(1, 1, 0), vec3(0, 0, 1), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		/* update material id buffer with BufferSubData */
		{
			const unsigned int data[] = { 3, 2, 1, 0 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		}

		/* update transform id buffer with BufferData */
		{
			const unsigned int data[] = { 0, 1, 2, 3 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 4);
		if (!ValidateWindow4Quads(vec3(1, 1, 0), vec3(0, 0, 1), vec3(1, 0, 0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}